

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_fragment.cpp
# Opt level: O3

void pstore::exchange::export_ns::emit_fragments
               (ostream *os,indent ind,database *db,uint generation,string_mapping *strings,
               bool comments)

{
  bool bVar1;
  uint uVar2;
  typed_address<pstore::trailer> tVar3;
  char *fragment_sep;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragments;
  anon_class_56_7_97667f36 out_fn;
  undefined1 local_95;
  uint local_94;
  char *local_90;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  database *local_78;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_70;
  long local_68;
  index *local_60;
  database *local_58;
  ostream *local_50;
  char **local_48;
  uint *local_40;
  string_mapping *local_38;
  undefined1 *local_30;
  
  local_95 = comments;
  local_94 = ind.distance_;
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&local_88,db,true);
  bVar1 = pstore::index::
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty(local_88);
  if (!bVar1) {
    local_90 = "\n";
    if (generation == 0) {
      assert_failed("generation > 0U",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_fragment.cpp"
                    ,0x39);
    }
    local_48 = &local_90;
    local_40 = &local_94;
    local_30 = &local_95;
    local_60 = (index *)&local_88;
    local_58 = db;
    local_50 = os;
    local_38 = strings;
    uVar2 = database::get_current_revision(db);
    if (generation - 1 <= uVar2) {
      tVar3 = database::older_revision_footer_pos(db,generation - 1);
      local_68 = (long)tVar3.a_.a_ + 0x70;
      local_70 = local_88;
      local_78 = db;
      if ((local_88->root_).internal_ != (internal_node *)0x0) {
        diff_details::
        traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
        ::
        visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                  ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                    *)&local_78,local_88->root_,0,(anon_class_56_7_97667f36 *)&local_60);
      }
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  return;
}

Assistant:

void emit_fragments (ostream & os, indent const ind, database const & db,
                                 unsigned const generation, string_mapping const & strings,
                                 bool const comments) {
                auto const fragments = index::get_index<trailer::indices::fragment> (db);
                if (!fragments->empty ()) {
                    auto const * fragment_sep = "\n";
                    PSTORE_ASSERT (generation > 0U);

                    auto const out_fn = [&] (address const addr) {
                        auto const & kvp = fragments->load_leaf_node (db, addr);
                        os << fragment_sep << ind;
                        emit_digest (os, kvp.first);
                        os << ':';
                        emit_fragment (os, ind, db, strings, db.getro (kvp.second), comments);
                        fragment_sep = ",\n";
                    };

                    diff (db, *fragments, generation - 1U, make_diff_out (&out_fn));
                }
            }